

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * sqlite3PExpr(Parse *pParse,int op,Expr *pLeft,Expr *pRight)

{
  Expr *pRoot;
  
  pRoot = (Expr *)sqlite3DbMallocRawNN(pParse->db,0x48);
  if (pRoot == (Expr *)0x0) {
    if (pLeft != (Expr *)0x0) {
      sqlite3ExprDeleteNN(pParse->db,pLeft);
    }
    if (pRight != (Expr *)0x0) {
      sqlite3ExprDeleteNN(pParse->db,pRight);
    }
  }
  else {
    pRoot->op = '\0';
    pRoot->affExpr = '\0';
    pRoot->op2 = '\0';
    pRoot->field_0x3 = 0;
    pRoot->flags = 0;
    (pRoot->u).zToken = (char *)0x0;
    pRoot->iColumn = 0;
    pRoot->iAgg = 0;
    pRoot->w = (anon_union_4_2_009eaf8f_for_w)0x0;
    pRoot->pAggInfo = (AggInfo *)0x0;
    (pRoot->x).pList = (ExprList *)0x0;
    pRoot->nHeight = 0;
    pRoot->iTable = 0;
    pRoot->pLeft = (Expr *)0x0;
    pRoot->pRight = (Expr *)0x0;
    (pRoot->y).pTab = (Table *)0x0;
    pRoot->op = (u8)op;
    pRoot->iAgg = -1;
    sqlite3ExprAttachSubtrees(pParse->db,pRoot,pLeft,pRight);
    if (pParse->db->aLimit[3] < pRoot->nHeight) {
      sqlite3ErrorMsg(pParse,"Expression tree is too large (maximum depth %d)");
    }
  }
  return pRoot;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3PExpr(
  Parse *pParse,          /* Parsing context */
  int op,                 /* Expression opcode */
  Expr *pLeft,            /* Left operand */
  Expr *pRight            /* Right operand */
){
  Expr *p;
  p = sqlite3DbMallocRawNN(pParse->db, sizeof(Expr));
  if( p ){
    memset(p, 0, sizeof(Expr));
    p->op = op & 0xff;
    p->iAgg = -1;
    sqlite3ExprAttachSubtrees(pParse->db, p, pLeft, pRight);
    sqlite3ExprCheckHeight(pParse, p->nHeight);
  }else{
    sqlite3ExprDelete(pParse->db, pLeft);
    sqlite3ExprDelete(pParse->db, pRight);
  }
  return p;
}